

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limits.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::constantIndexExpressionCheck(TParseContext *this,TIntermNode *index)

{
  undefined **local_88;
  undefined1 local_80;
  undefined7 local_7f;
  undefined4 uStack_78;
  TPoolAllocator *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  TIdSetType *local_50;
  char local_48;
  undefined1 local_40 [24];
  
  local_80 = 1;
  local_7f = 0;
  uStack_78 = 0;
  local_70 = GetThreadPoolAllocator();
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  local_88 = &PTR__TIntermTraverser_0092ccb8;
  local_48 = '\0';
  local_50 = &this->inductiveLoopIds;
  (*index->_vptr_TIntermNode[2])(index,&local_88);
  if (local_48 == '\x01') {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,local_40,"Non-constant-index-expression","limitations","");
  }
  return;
}

Assistant:

void TParseContext::constantIndexExpressionCheck(TIntermNode* index)
{
    TIndexTraverser it(inductiveLoopIds);

    index->traverse(&it);

    if (it.bad)
        error(it.badLoc, "Non-constant-index-expression", "limitations", "");
}